

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O2

void __thiscall
CUIRect::Draw4(CUIRect *this,vec4 *ColorTopLeft,vec4 *ColorTopRight,vec4 *ColorBottomLeft,
              vec4 *ColorBottomRight,float Rounding,int Corners)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  long lVar19;
  uint uVar20;
  long in_FS_OFFSET;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  CQuadItem ItemQ;
  float fStack_48;
  float fStack_44;
  
  lVar19 = *(long *)(in_FS_OFFSET + 0x28);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffffffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  auVar27._0_4_ = -(uint)((Corners & 8U) == 0);
  auVar27._4_4_ = -(uint)((Corners & 4U) == 0);
  auVar27._8_4_ = -(uint)((Corners & 2U) == 0);
  auVar27._12_4_ = -(uint)((Corners & 1U) == 0);
  auVar26._0_4_ = -(uint)((Corners & 0x80U) == 0);
  auVar26._4_4_ = -(uint)((Corners & 0x40U) == 0);
  auVar26._8_4_ = -(uint)((Corners & 0x20U) == 0);
  auVar26._12_4_ = -(uint)((Corners & 0x10U) == 0);
  auVar27 = packssdw(auVar26,auVar27);
  auVar27 = packsswb(auVar27,auVar27);
  uVar20 = 0;
  while (uVar20 < 8) {
    fVar28 = (float)(int)uVar20;
    fVar25 = (float)(int)(uVar20 + 1) / 5.092958;
    uVar20 = uVar20 + 2;
    fVar21 = cosf(fVar28 / 5.092958);
    cosf(fVar25);
    fVar22 = cosf((float)(int)uVar20 / 5.092958);
    fVar28 = sinf(fVar28 / 5.092958);
    sinf(fVar25);
    fVar25 = sinf((float)(int)uVar20 / 5.092958);
    if ((auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorTopLeft);
      uVar1 = this->x;
      uVar10 = this->y;
      ItemQ.m_X = (float)uVar1 + Rounding;
      ItemQ.m_Y = (float)uVar10 + Rounding;
      ItemQ.m_Height = (1.0 - fVar28) * Rounding + (float)uVar10;
      ItemQ.m_Width = (1.0 - fVar21) * Rounding + (float)uVar1;
      fStack_48 = (1.0 - fVar22) * Rounding + (float)uVar1;
      fStack_44 = (1.0 - fVar25) * Rounding + (float)uVar10;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorTopRight);
      fVar23 = this->y;
      ItemQ.m_X = (this->x + this->w) - Rounding;
      ItemQ.m_Y = fVar23 + Rounding;
      ItemQ.m_Height = (1.0 - fVar28) * Rounding + fVar23;
      ItemQ.m_Width = fVar21 * Rounding + ItemQ.m_X;
      fStack_48 = fVar22 * Rounding + ItemQ.m_X;
      fStack_44 = (1.0 - fVar25) * Rounding + fVar23;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorBottomLeft);
      fVar23 = this->x;
      ItemQ.m_Y = (this->y + this->h) - Rounding;
      ItemQ.m_X = fVar23 + Rounding;
      ItemQ.m_Width = (1.0 - fVar21) * Rounding + fVar23;
      ItemQ.m_Height = fVar28 * Rounding + ItemQ.m_Y;
      fStack_48 = (1.0 - fVar22) * Rounding + fVar23;
      fStack_44 = fVar25 * Rounding + ItemQ.m_Y;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorBottomRight);
      uVar2 = this->x;
      uVar11 = this->y;
      uVar3 = this->w;
      uVar12 = this->h;
      ItemQ.m_X = ((float)uVar3 + (float)uVar2) - Rounding;
      ItemQ.m_Y = ((float)uVar12 + (float)uVar11) - Rounding;
      ItemQ.m_Height = fVar28 * Rounding + ItemQ.m_Y;
      ItemQ.m_Width = fVar21 * Rounding + ItemQ.m_X;
      fStack_48 = fVar22 * Rounding + ItemQ.m_X;
      fStack_44 = fVar25 * Rounding + ItemQ.m_Y;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorTopLeft);
      ItemQ.m_X = this->x;
      ItemQ.m_Y = this->y;
      ItemQ.m_Height = fVar28 * Rounding + (ItemQ.m_Y - Rounding);
      ItemQ.m_Width = (1.0 - fVar21) * Rounding + ItemQ.m_X;
      fStack_48 = (1.0 - fVar22) * Rounding + ItemQ.m_X;
      fStack_44 = fVar25 * Rounding + (ItemQ.m_Y - Rounding);
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorTopRight);
      ItemQ.m_X = this->x + this->w;
      ItemQ.m_Y = this->y;
      fVar23 = ItemQ.m_X - Rounding;
      fVar24 = this->y - Rounding;
      ItemQ.m_Height = fVar28 * Rounding + fVar24;
      ItemQ.m_Width = fVar21 * Rounding + fVar23;
      fStack_48 = fVar22 * Rounding + fVar23;
      fStack_44 = fVar25 * Rounding + fVar24;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorBottomLeft);
      ItemQ.m_X = this->x;
      ItemQ.m_Y = this->y + this->h;
      ItemQ.m_Height = (1.0 - fVar28) * Rounding + ItemQ.m_Y;
      ItemQ.m_Width = (1.0 - fVar21) * Rounding + ItemQ.m_X;
      fStack_48 = (1.0 - fVar22) * Rounding + ItemQ.m_X;
      fStack_44 = (1.0 - fVar25) * Rounding + ItemQ.m_Y;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
    if ((auVar27 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      IGraphics::SetColor(s_pGraphics,ColorBottomRight);
      uVar4 = this->x;
      uVar13 = this->y;
      uVar5 = this->w;
      uVar14 = this->h;
      fVar23 = (float)uVar5 + (float)uVar4;
      fVar24 = (float)uVar14 + (float)uVar13;
      ItemQ.m_Y = fVar24;
      ItemQ.m_X = fVar23;
      ItemQ.m_Width = fVar21 * Rounding + (fVar23 - Rounding);
      ItemQ.m_Height = (1.0 - fVar28) * Rounding + fVar24;
      fStack_48 = fVar22 * Rounding + (fVar23 - Rounding);
      fStack_44 = (1.0 - fVar25) * Rounding + fVar24;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&ItemQ,1);
    }
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopRight,ColorBottomLeft,ColorBottomRight);
  fVar21 = -Rounding;
  uVar6 = this->x;
  uVar15 = this->y;
  ItemQ.m_X = (float)uVar6 + Rounding;
  ItemQ.m_Y = (float)uVar15 + Rounding;
  uVar7 = this->w;
  uVar16 = this->h;
  ItemQ.m_Width = (float)uVar7 - (Rounding + Rounding);
  ItemQ.m_Height = (float)uVar16 - (Rounding + Rounding);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopRight,ColorTopLeft,ColorTopRight);
  fVar22 = fVar21 - Rounding;
  ItemQ.m_Y = this->y;
  ItemQ.m_X = this->x + Rounding;
  ItemQ.m_Height = Rounding;
  ItemQ.m_Width = this->w + fVar22;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorBottomLeft,ColorBottomRight,ColorBottomLeft,ColorBottomRight);
  ItemQ.m_Y = (this->y + this->h) - Rounding;
  ItemQ.m_X = this->x + Rounding;
  ItemQ.m_Width = this->w + fVar22;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopLeft,ColorTopLeft,ColorBottomLeft,ColorBottomLeft);
  ItemQ.m_Y = this->y + Rounding;
  ItemQ.m_X = this->x;
  ItemQ.m_Height = this->h + fVar22;
  ItemQ.m_Width = Rounding;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])
            (s_pGraphics,ColorTopRight,ColorTopRight,ColorBottomRight,ColorBottomRight);
  ItemQ.m_Y = this->y + Rounding;
  ItemQ.m_X = (this->x + this->w) - Rounding;
  ItemQ.m_Height = fVar22 + this->h;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  if ((auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    IGraphics::SetColor(s_pGraphics,ColorTopLeft);
    ItemQ.m_X = this->x;
    ItemQ.m_Y = this->y;
    ItemQ.m_Height = Rounding;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  }
  if ((auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    IGraphics::SetColor(s_pGraphics,ColorTopRight);
    ItemQ.m_Y = this->y;
    ItemQ.m_X = this->x + this->w;
    ItemQ.m_Height = Rounding;
    ItemQ.m_Width = fVar21;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  }
  if ((auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    IGraphics::SetColor(s_pGraphics,ColorBottomLeft);
    ItemQ.m_Y = this->y + this->h;
    ItemQ.m_X = this->x;
    ItemQ.m_Height = fVar21;
    ItemQ.m_Width = Rounding;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  }
  if ((auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    IGraphics::SetColor(s_pGraphics,ColorBottomRight);
    uVar8 = this->x;
    uVar17 = this->y;
    uVar9 = this->w;
    uVar18 = this->h;
    ItemQ.m_X = (float)uVar9 + (float)uVar8;
    ItemQ.m_Y = (float)uVar18 + (float)uVar17;
    ItemQ.m_Height = fVar21;
    ItemQ.m_Width = fVar21;
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&ItemQ,1);
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar19) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::Draw4(const vec4 &ColorTopLeft, const vec4 &ColorTopRight, const vec4 &ColorBottomLeft, const vec4 &ColorBottomRight, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();

	const float r = Rounding;

	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i+=2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_TR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}
	}

	// center
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// top
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorTopLeft, ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// bottom
	{
		s_pGraphics->SetColor4(ColorBottomLeft, ColorBottomRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// left
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopLeft, ColorBottomLeft, ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// right
	{
		s_pGraphics->SetColor4(ColorTopRight, ColorTopRight, ColorBottomRight, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TL))
	{
		s_pGraphics->SetColor(ColorTopLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y, r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TR))
	{
		s_pGraphics->SetColor(ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y, -r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BL))
	{
		s_pGraphics->SetColor(ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+h, r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BR))
	{
		s_pGraphics->SetColor(ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y+h, -r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	s_pGraphics->QuadsEnd();
}